

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,RepeatStatement *repeat_stmt,void *data)

{
  size_t *psVar1;
  SyntaxTree *pSVar2;
  GenerateFunction *pGVar3;
  uint uVar4;
  size_t sVar5;
  _List_node_base *p_Var6;
  ExpVarData_conflict exp_var_data;
  Guard l;
  Guard g;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  Guard local_40;
  
  local_80._8_8_ = 0;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:833:9)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:833:9)>
             ::_M_manager;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:833:9)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:833:9)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  local_80._M_unused._M_object = this;
  Guard::Guard(&local_40,(function<void_()> *)&local_80,(function<void_()> *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:834:9)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:834:9)>
             ::_M_manager;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:834:9)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:834:9)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  local_c8._8_8_ = repeat_stmt;
  local_a8._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_80,(function<void_()> *)&local_c8,(function<void_()> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:836:13)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:836:13)>
             ::_M_manager;
  local_60._12_4_ = 0;
  local_60._8_4_ = this->current_function_->register_id_;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:836:13)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:836:13)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_c8,(function<void_()> *)&local_a8,(function<void_()> *)&local_60);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  pSVar2 = (repeat_stmt->block_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,0);
  Guard::~Guard((Guard *)&local_c8);
  uVar4 = GenerateRegisterId(this);
  local_c8._4_4_ = uVar4 + 1;
  local_c8._0_4_ = uVar4;
  pSVar2 = (repeat_stmt->exp_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
  sVar5 = Function::AddInstruction
                    (this->current_function_->function_,
                     (Instruction)((uVar4 & 0xff) << 0x10 | 0xf000000),repeat_stmt->line_);
  pGVar3 = this->current_function_;
  p_Var6 = (_List_node_base *)operator_new(0x20);
  p_Var6[1]._M_next = (_List_node_base *)repeat_stmt;
  *(undefined4 *)&p_Var6[1]._M_prev = 0;
  *(int *)((long)&p_Var6[1]._M_prev + 4) = (int)sVar5;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(pGVar3->loop_jumps_).
            super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  Guard::~Guard((Guard *)&local_80);
  Guard::~Guard(&local_40);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(RepeatStatement *repeat_stmt, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
        LOOP_GUARD(repeat_stmt);
        {
            REGISTER_GENERATOR_GUARD();
            repeat_stmt->block_->Accept(this, nullptr);
        }

        // Get exp value
        auto register_id = GenerateRegisterId();
        ExpVarData exp_var_data{ register_id, register_id + 1 };
        repeat_stmt->exp_->Accept(this, &exp_var_data);

        // Jump to head when exp value is true
        auto function = GetCurrentFunction();
        auto instruction = Instruction::AsBxCode(OpType_JmpFalse, register_id, 0);
        int index = function->AddInstruction(instruction, repeat_stmt->line_);
        AddLoopJumpInfo(repeat_stmt, index, LoopJumpInfo::JumpHead);
    }